

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::PrintSymbolFlags
          (BinaryReaderObjdump *this,uint32_t flags)

{
  uint uVar1;
  pointer this_00;
  char *pcStack_38;
  SymbolVisibility vis;
  char *vis_name;
  char *pcStack_28;
  SymbolBinding binding;
  char *binding_name;
  uint32_t flags_local;
  BinaryReaderObjdump *this_local;
  
  if (flags < 0x400) {
    pcStack_28 = (char *)0x0;
    uVar1 = flags & 3;
    if (uVar1 == 0) {
      pcStack_28 = "global";
    }
    else if (uVar1 == 1) {
      pcStack_28 = "weak";
    }
    else if (uVar1 == 2) {
      pcStack_28 = "local";
    }
    pcStack_38 = (char *)0x0;
    if ((flags & 4) == 0) {
      pcStack_38 = "default";
    }
    else if ((flags & 4) == 4) {
      pcStack_38 = "hidden";
    }
    binding_name._4_4_ = flags & 0xfffffff8;
    PrintDetails(this," [");
    if ((flags & 0x10) != 0) {
      PrintDetails(this," undefined");
      binding_name._4_4_ = flags & 0xffffffe8;
    }
    if ((binding_name._4_4_ & 0x20) != 0) {
      PrintDetails(this," exported");
      binding_name._4_4_ = binding_name._4_4_ & 0xffffffdf;
    }
    if ((binding_name._4_4_ & 0x40) != 0) {
      PrintDetails(this," explicit_name");
      binding_name._4_4_ = binding_name._4_4_ & 0xffffffbf;
    }
    if ((binding_name._4_4_ & 0x80) != 0) {
      PrintDetails(this," no_strip");
      binding_name._4_4_ = binding_name._4_4_ & 0xffffff7f;
    }
    if ((binding_name._4_4_ & 0x100) != 0) {
      PrintDetails(this," tls");
      binding_name._4_4_ = binding_name._4_4_ & 0xfffffeff;
    }
    if ((binding_name._4_4_ & 0x200) != 0) {
      PrintDetails(this," abs");
      binding_name._4_4_ = binding_name._4_4_ & 0xfffffdff;
    }
    if (binding_name._4_4_ != 0) {
      PrintDetails(this," unknown_flags=%#x",(ulong)binding_name._4_4_);
    }
    PrintDetails(this," binding=%s vis=%s ]\n",pcStack_28,pcStack_38);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    this_00 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator->
                        (&(this->super_BinaryReaderObjdumpBase).err_stream_);
    Stream::Writef(&this_00->super_Stream,"Unknown symbols flags: %x\n",(ulong)flags);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::PrintSymbolFlags(uint32_t flags) {
  if (flags > WABT_SYMBOL_FLAG_MAX) {
    err_stream_->Writef("Unknown symbols flags: %x\n", flags);
    return Result::Error;
  }

  const char* binding_name = nullptr;
  SymbolBinding binding =
      static_cast<SymbolBinding>(flags & WABT_SYMBOL_MASK_BINDING);
  switch (binding) {
    case SymbolBinding::Global:
      binding_name = "global";
      break;
    case SymbolBinding::Local:
      binding_name = "local";
      break;
    case SymbolBinding::Weak:
      binding_name = "weak";
      break;
  }
  flags &= ~WABT_SYMBOL_MASK_BINDING;

  const char* vis_name = nullptr;
  SymbolVisibility vis =
      static_cast<SymbolVisibility>(flags & WABT_SYMBOL_MASK_VISIBILITY);
  switch (vis) {
    case SymbolVisibility::Hidden:
      vis_name = "hidden";
      break;
    case SymbolVisibility::Default:
      vis_name = "default";
      break;
  }
  flags &= ~WABT_SYMBOL_MASK_VISIBILITY;

  PrintDetails(" [");
  if (flags & WABT_SYMBOL_FLAG_UNDEFINED) {
    PrintDetails(" undefined");
    flags &= ~WABT_SYMBOL_FLAG_UNDEFINED;
  }
  if (flags & WABT_SYMBOL_FLAG_EXPORTED) {
    PrintDetails(" exported");
    flags &= ~WABT_SYMBOL_FLAG_EXPORTED;
  }
  if (flags & WABT_SYMBOL_FLAG_EXPLICIT_NAME) {
    PrintDetails(" explicit_name");
    flags &= ~WABT_SYMBOL_FLAG_EXPLICIT_NAME;
  }
  if (flags & WABT_SYMBOL_FLAG_NO_STRIP) {
    PrintDetails(" no_strip");
    flags &= ~WABT_SYMBOL_FLAG_NO_STRIP;
  }
  if (flags & WABT_SYMBOL_FLAG_TLS) {
    PrintDetails(" tls");
    flags &= ~WABT_SYMBOL_FLAG_TLS;
  }
  if (flags & WABT_SYMBOL_FLAG_ABS) {
    PrintDetails(" abs");
    flags &= ~WABT_SYMBOL_FLAG_ABS;
  }
  if (flags != 0) {
    PrintDetails(" unknown_flags=%#x", flags);
  }
  PrintDetails(" binding=%s vis=%s ]\n", binding_name, vis_name);
  return Result::Ok;
}